

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigObj.c
# Opt level: O0

void Aig_ObjReplace(Aig_Man_t *p,Aig_Obj_t *pObjOld,Aig_Obj_t *pObjNew,int fUpdateLevel)

{
  undefined8 uVar1;
  int iVar2;
  int b;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  uint uVar5;
  int LevelOld;
  Aig_Obj_t *pFanin1;
  Aig_Obj_t *pFanin0;
  Aig_Obj_t *pObjNewR;
  int fUpdateLevel_local;
  Aig_Obj_t *pObjNew_local;
  Aig_Obj_t *pObjOld_local;
  Aig_Man_t *p_local;
  
  pAVar3 = Aig_Regular(pObjNew);
  iVar2 = Aig_IsComplement(pObjOld);
  if (iVar2 != 0) {
    __assert_fail("!Aig_IsComplement(pObjOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aigObj.c"
                  ,0x1d7,"void Aig_ObjReplace(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, int)");
  }
  iVar2 = Aig_ObjIsCi(pObjOld);
  if ((iVar2 != 0) || (iVar2 = Aig_ObjIsCo(pObjOld), iVar2 != 0)) {
    __assert_fail("!Aig_ObjIsCi(pObjOld) && !Aig_ObjIsCo(pObjOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aigObj.c"
                  ,0x1d9,"void Aig_ObjReplace(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, int)");
  }
  iVar2 = Aig_ObjIsBuf(pAVar3);
  if ((iVar2 != 0) || (iVar2 = Aig_ObjIsCo(pAVar3), iVar2 != 0)) {
    __assert_fail("!Aig_ObjIsBuf(pObjNewR) && !Aig_ObjIsCo(pObjNewR)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aigObj.c"
                  ,0x1db,"void Aig_ObjReplace(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, int)");
  }
  if (pObjOld == pAVar3) {
    __assert_fail("pObjOld != pObjNewR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aigObj.c"
                  ,0x1dd,"void Aig_ObjReplace(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, int)");
  }
  pAVar4 = Aig_ObjFanin0(pAVar3);
  if (pObjOld != pAVar4) {
    pAVar4 = Aig_ObjFanin1(pAVar3);
    if (pObjOld == pAVar4) {
      __assert_fail("pObjOld != Aig_ObjFanin1(pObjNewR)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aigObj.c"
                    ,0x1e0,"void Aig_ObjReplace(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, int)");
    }
    pAVar4 = Aig_ObjFanin0(pAVar3);
    if ((pObjOld != pAVar4) && (pAVar4 = Aig_ObjFanin1(pAVar3), pObjOld != pAVar4)) {
      *(ulong *)&pAVar3->field_0x18 =
           *(ulong *)&pAVar3->field_0x18 & 0xffffffff0000003f |
           ((ulong)(((uint)(*(ulong *)&pAVar3->field_0x18 >> 6) & 0x3ffffff) + 1) & 0x3ffffff) << 6;
      Aig_ObjDelete_rec(p,pObjOld,0);
      *(ulong *)&pAVar3->field_0x18 =
           *(ulong *)&pAVar3->field_0x18 & 0xffffffff0000003f |
           ((ulong)(((uint)(*(ulong *)&pAVar3->field_0x18 >> 6) & 0x3ffffff) - 1) & 0x3ffffff) << 6;
      uVar5 = (uint)*(undefined8 *)&pObjOld->field_0x18 & 7;
      p->nObjs[uVar5] = p->nObjs[uVar5] + -1;
      iVar2 = Aig_IsComplement(pObjNew);
      if (((iVar2 == 0) && (iVar2 = Aig_ObjRefs(pObjNew), iVar2 < 1)) &&
         (iVar2 = Aig_ObjIsNode(pObjNew), iVar2 != 0)) {
        pAVar3 = pObjNew->pFanin0;
        pAVar4 = pObjNew->pFanin1;
        uVar1 = *(undefined8 *)&pObjOld->field_0x18;
        *(ulong *)&pObjOld->field_0x18 =
             *(ulong *)&pObjOld->field_0x18 & 0xfffffffffffffff8 |
             (ulong)((uint)*(undefined8 *)&pObjNew->field_0x18 & 7);
        Aig_ObjDisconnect(p,pObjNew);
        Aig_ObjConnect(p,pObjOld,pAVar3,pAVar4);
        Aig_ObjDelete(p,pObjNew);
        if (p->pFanData != (int *)0x0) {
          *(ulong *)&pObjOld->field_0x18 =
               *(ulong *)&pObjOld->field_0x18 & 0xff000000ffffffff |
               (ulong)((uint)((ulong)uVar1 >> 0x20) & 0xffffff) << 0x20;
          Aig_ManUpdateLevel(p,pObjOld);
        }
        if (fUpdateLevel != 0) {
          Aig_ObjClearReverseLevel(p,pObjOld);
          Aig_ManUpdateReverseLevel(p,pObjOld);
        }
      }
      else {
        *(ulong *)&pObjOld->field_0x18 = *(ulong *)&pObjOld->field_0x18 & 0xfffffffffffffff8 | 4;
        Aig_ObjConnect(p,pObjOld,pObjNew,(Aig_Obj_t *)0x0);
        p->nBufReplaces = p->nBufReplaces + 1;
      }
      uVar5 = (uint)*(undefined8 *)&pObjOld->field_0x18 & 7;
      p->nObjs[uVar5] = p->nObjs[uVar5] + 1;
      if ((p->pFanData != (int *)0x0) && (iVar2 = Aig_ObjIsBuf(pObjOld), iVar2 != 0)) {
        Vec_PtrPush(p->vBufs,pObjOld);
        iVar2 = p->nBufMax;
        b = Vec_PtrSize(p->vBufs);
        iVar2 = Abc_MaxInt(iVar2,b);
        p->nBufMax = iVar2;
        Aig_ManPropagateBuffers(p,fUpdateLevel);
      }
      return;
    }
    printf("Aig_ObjReplace(): Internal error!\n");
    exit(1);
  }
  __assert_fail("pObjOld != Aig_ObjFanin0(pObjNewR)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aigObj.c"
                ,0x1df,"void Aig_ObjReplace(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, int)");
}

Assistant:

void Aig_ObjReplace( Aig_Man_t * p, Aig_Obj_t * pObjOld, Aig_Obj_t * pObjNew, int fUpdateLevel )
{
    Aig_Obj_t * pObjNewR = Aig_Regular(pObjNew);
    // the object to be replaced cannot be complemented
    assert( !Aig_IsComplement(pObjOld) );
    // the object to be replaced cannot be a terminal
    assert( !Aig_ObjIsCi(pObjOld) && !Aig_ObjIsCo(pObjOld) );
    // the object to be used cannot be a buffer or a PO
    assert( !Aig_ObjIsBuf(pObjNewR) && !Aig_ObjIsCo(pObjNewR) );
    // the object cannot be the same
    assert( pObjOld != pObjNewR );
    // make sure object is not pointing to itself
    assert( pObjOld != Aig_ObjFanin0(pObjNewR) );
    assert( pObjOld != Aig_ObjFanin1(pObjNewR) );
    if ( pObjOld == Aig_ObjFanin0(pObjNewR) || pObjOld == Aig_ObjFanin1(pObjNewR) )
    {
        printf( "Aig_ObjReplace(): Internal error!\n" );
        exit(1);
    }
    // recursively delete the old node - but leave the object there
    pObjNewR->nRefs++;
    Aig_ObjDelete_rec( p, pObjOld, 0 );
    pObjNewR->nRefs--;
    // if the new object is complemented or already used, create a buffer
    p->nObjs[pObjOld->Type]--;
    if ( Aig_IsComplement(pObjNew) || Aig_ObjRefs(pObjNew) > 0 || !Aig_ObjIsNode(pObjNew) )
    {
        pObjOld->Type = AIG_OBJ_BUF;
        Aig_ObjConnect( p, pObjOld, pObjNew, NULL );
        p->nBufReplaces++;
    }
    else
    {
        Aig_Obj_t * pFanin0 = pObjNew->pFanin0;
        Aig_Obj_t * pFanin1 = pObjNew->pFanin1;
        int LevelOld = pObjOld->Level;
        pObjOld->Type = pObjNew->Type;
        Aig_ObjDisconnect( p, pObjNew );
        Aig_ObjConnect( p, pObjOld, pFanin0, pFanin1 );
        // delete the new object
        Aig_ObjDelete( p, pObjNew );
        // update levels
        if ( p->pFanData )
        {
            pObjOld->Level = LevelOld;
            Aig_ManUpdateLevel( p, pObjOld );
        }
        if ( fUpdateLevel )
        {
            Aig_ObjClearReverseLevel( p, pObjOld );
            Aig_ManUpdateReverseLevel( p, pObjOld );
        }
    }
    p->nObjs[pObjOld->Type]++;
    // store buffers if fanout is allocated
    if ( p->pFanData && Aig_ObjIsBuf(pObjOld) )
    {
        Vec_PtrPush( p->vBufs, pObjOld );
        p->nBufMax = Abc_MaxInt( p->nBufMax, Vec_PtrSize(p->vBufs) );
        Aig_ManPropagateBuffers( p, fUpdateLevel );
    }
}